

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManSpecBuildInit
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vXorLits,int f,int fDualOut)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  
  iVar1 = Gia_ObjId(p,pObj);
  pObj_00 = Gia_ObjReprObj(p,iVar1);
  if (pObj_00 == (Gia_Obj_t *)0x0) {
    return;
  }
  if (fDualOut != 0) {
    iVar1 = Gia_ObjId(p,pObj);
    iVar2 = Gia_ObjId(p,pObj_00);
    iVar1 = Gia_ObjDiffColors2(p,iVar1,iVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  iVar1 = Gia_ObjCopyF(p,f,pObj_00);
  iVar1 = Abc_LitNotCond(iVar1,((uint)pObj_00 ^ (uint)pObj) & 1 ^
                               (uint)((ulong)*(undefined8 *)((ulong)pObj & 0xfffffffffffffffe) >>
                                     0x3f) ^
                               (uint)((ulong)*(undefined8 *)((ulong)pObj_00 & 0xfffffffffffffffe) >>
                                     0x3f));
  iVar2 = Gia_ObjCopyF(p,f,pObj);
  if ((iVar2 != iVar1) && (iVar2 = Gia_ObjId(p,pObj), (p->pReprs[iVar2].field_0x3 & 0x10) == 0)) {
    iVar2 = Gia_ObjCopyF(p,f,pObj);
    iVar2 = Gia_ManHashXor(pNew,iVar2,iVar1);
    Vec_IntPush(vXorLits,iVar2);
  }
  Gia_ObjSetCopyF(p,f,pObj,iVar1);
  return;
}

Assistant:

void Gia_ManSpecBuildInit( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vXorLits, int f, int fDualOut )
{
    Gia_Obj_t * pRepr;
    int iLitNew;
    pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
    if ( pRepr == NULL )
        return;
//    if ( fDualOut && !Gia_ObjDiffColors( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
    if ( fDualOut && !Gia_ObjDiffColors2( p, Gia_ObjId(p, pObj), Gia_ObjId(p, pRepr) ) )
        return;
    iLitNew = Abc_LitNotCond( Gia_ObjCopyF(p, f, pRepr), Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
    if ( Gia_ObjCopyF(p, f, pObj) != iLitNew && !Gia_ObjProved(p, Gia_ObjId(p,pObj)) )
        Vec_IntPush( vXorLits, Gia_ManHashXor(pNew, Gia_ObjCopyF(p, f, pObj), iLitNew) );
    Gia_ObjSetCopyF( p, f, pObj, iLitNew );
}